

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O0

void __thiscall
tcu::ResultCollector::ResultCollector(ResultCollector *this,TestLog *log,string *prefix)

{
  allocator<char> local_21;
  string *local_20;
  string *prefix_local;
  TestLog *log_local;
  ResultCollector *this_local;
  
  this->m_log = log;
  local_20 = prefix;
  prefix_local = (string *)log;
  log_local = (TestLog *)this;
  std::__cxx11::string::string((string *)&this->m_prefix,(string *)prefix);
  this->m_result = QP_TEST_RESULT_LAST;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_message,"Pass",&local_21);
  std::allocator<char>::~allocator(&local_21);
  return;
}

Assistant:

ResultCollector::ResultCollector (TestLog& log, const std::string& prefix)
	: m_log		(&log)
	, m_prefix	(prefix)
	, m_result	(QP_TEST_RESULT_LAST)
	, m_message ("Pass")
{
}